

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context,
          CaseDefinition caseDef)

{
  size_type *psVar1;
  ostringstream *poVar2;
  float *pfVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  uint uVar5;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  pointer pfVar9;
  Context *pCVar10;
  Context *pCVar11;
  VkCommandBuffer commandBuffer;
  Allocation *pAVar12;
  Vec4 VVar13;
  bool bVar14;
  int iVar15;
  float fVar16;
  int iVar17;
  int iVar18;
  deUint32 stride;
  InstanceInterface *pIVar19;
  VkPhysicalDevice pVVar20;
  DeviceInterface *pDVar21;
  VkDevice pVVar22;
  float (*pafVar23) [3];
  TextureFormat TVar24;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  GraphicsPipelineBuilder *pGVar25;
  const_iterator cVar26;
  float *pfVar27;
  TestLog *pTVar28;
  long *plVar29;
  undefined8 *puVar30;
  long lVar31;
  ConstPixelBufferAccess *access;
  float *pfVar32;
  void *__buf;
  ulong uVar33;
  VkDeviceSize VVar34;
  byte bVar35;
  int j;
  char *pcVar36;
  undefined8 uVar37;
  ulong *puVar38;
  long lVar39;
  int iVar40;
  ulong uVar41;
  uint z;
  float fVar42;
  float fVar43;
  uint uVar44;
  uint uVar45;
  float fVar46;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  uint local_9a8;
  uint local_9a4;
  vector<float,_std::allocator<float>_> attributes;
  key_type local_978;
  ulong local_958;
  IVec2 renderSize;
  key_type local_938;
  VkDevice local_918;
  DeviceInterface *local_910;
  ulong *local_908;
  long local_900;
  ulong local_8f8;
  undefined8 uStack_8f0;
  ulong *local_8e8;
  long local_8e0;
  ulong local_8d8;
  long lStack_8d0;
  TestStatus *local_8c8;
  Allocator *local_8c0;
  Context *local_8b8;
  undefined8 local_8b0;
  long *local_8a8;
  undefined8 local_8a0;
  long local_898;
  undefined8 uStack_890;
  ulong *local_888;
  long local_880;
  ulong local_878;
  long lStack_870;
  ulong *local_868;
  long local_860;
  ulong local_858;
  long lStack_850;
  ulong local_848;
  ulong local_840;
  deUint32 local_834;
  ulong local_830;
  TextureFormat local_828;
  int iStack_820;
  int iStack_81c;
  int local_818;
  int local_80c;
  void *local_808;
  ulong *local_800;
  long local_7f8;
  ulong local_7f0 [2];
  ulong *local_7e0;
  long local_7d8;
  ulong local_7d0 [2];
  ulong *local_7c0;
  long local_7b8;
  ulong local_7b0 [2];
  ConstPixelBufferAccess imagePixelAccess;
  float choices [6] [3];
  float local_70c;
  ios_base local_700 [132];
  deUint32 local_67c;
  bool local_678;
  VkPrimitiveTopology local_674;
  long local_5f8;
  long *plStack_5f0;
  float local_5e8 [2];
  float afStack_5e0 [2];
  VkCommandBuffer local_5d8;
  long *plStack_5d0;
  float local_5c8 [2];
  float afStack_5c0 [2];
  VkRenderPass local_5b8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_5b0;
  VkQueue local_590;
  ulong *local_588;
  undefined8 local_580;
  undefined1 local_578;
  undefined7 uStack_577;
  VkPipelineLayout local_568;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_560;
  VkDescriptorSetLayout local_548;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_540;
  Image local_528;
  Buffer local_4f8;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined4 local_4b8;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined4 local_498;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined4 local_478;
  VkPipeline local_468;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_460;
  VkCommandPool local_448;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_440;
  VkFramebuffer local_428;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_420;
  VkImageView local_408;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_400;
  VkDescriptorPool local_3e8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_3e0;
  Buffer local_3c8;
  key_type local_398 [3];
  ios_base local_328 [264];
  VkDescriptorBufferInfo resultBufferInfo;
  Buffer local_208;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [6];
  ios_base local_160 [264];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 auStack_40 [2];
  
  local_8c8 = __return_storage_ptr__;
  pIVar19 = Context::getInstanceInterface((Context *)this);
  pVVar20 = Context::getPhysicalDevice((Context *)this);
  requireFeatures(pIVar19,pVVar20,9);
  iVar15 = (int)pVVar20;
  pDVar21 = Context::getDeviceInterface((Context *)this);
  pVVar22 = Context::getDevice((Context *)this);
  local_590 = Context::getUniversalQueue((Context *)this);
  local_834 = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_8c0 = Context::getDefaultAllocator((Context *)this);
  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pafVar23 = choices;
  lVar31 = 0;
  do {
    lVar39 = 0;
    do {
      pcVar36 = "N3vkt17FunctionInstance1INS_12tessellation12_GLOBAL__N_114CaseDefinitionEEE" +
                lVar39 + 0x4a;
      if (lVar39 == 0) {
        pcVar36 = (char *)(&tessellation::(anonymous_namespace)::genAttributes(bool)::baseTessLevels
                          + lVar31);
      }
      if ((caseDef._0_8_ >> 0x28 & 1) == 0) {
        pcVar36 = (char *)(&tessellation::(anonymous_namespace)::genAttributes(bool)::baseTessLevels
                          + lVar31);
      }
      *(undefined4 *)((long)*pafVar23 + lVar39) = *(undefined4 *)pcVar36;
      lVar39 = lVar39 + 4;
    } while (lVar39 != 0xc);
    lVar31 = lVar31 + 1;
    pafVar23 = pafVar23 + 1;
  } while (lVar31 != 6);
  local_918 = pVVar22;
  local_910 = pDVar21;
  local_8b8 = context;
  local_848 = caseDef._0_8_;
  local_830 = (ulong)context >> 0x20;
  iVar15 = intPow(3,iVar15);
  fVar42 = (float)iVar15;
  fVar46 = 2.0 / fVar42;
  uStack_1d0._0_4_ = 0.0;
  iVar40 = 0;
  local_8b0 = (tessellation *)((ulong)local_8b0._4_4_ << 0x20);
  do {
    uStack_1d0._4_4_ = 0.0;
    fVar16 = 0.0;
    do {
      local_840 = CONCAT44(local_840._4_4_,fVar16);
      auVar6._12_4_ = 0;
      auVar6._0_12_ = local_1c8[0]._4_12_;
      local_1c8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )(auVar6 << 0x20);
      iVar17 = 0;
      do {
        local_1c8[0]._M_allocated_capacity._4_4_ = 0;
        iVar18 = 0;
        do {
          local_958 = CONCAT44(local_958._4_4_,iVar18);
          auVar7._12_4_ = 0;
          auVar7._0_12_ = stack0xfffffffffffffe2c;
          _local_1d8 = (float  [4])(auVar7 << 0x20);
          fVar16 = 0.0;
          do {
            local_1d8._4_4_ = 0;
            iVar18 = 0;
            do {
              pafVar23 = choices;
              lVar31 = 0;
              do {
                if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&attributes,
                             (iterator)
                             attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                             *pafVar23 + *(int *)(local_1d8 + lVar31 * 4));
                }
                else {
                  *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = (*pafVar23)[*(int *)(local_1d8 + lVar31 * 4)]
                  ;
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                lVar31 = lVar31 + 1;
                pafVar23 = pafVar23 + 1;
              } while (lVar31 != 6);
              if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_398[0]._M_dataplus._M_p._0_4_ = fVar46;
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&attributes,
                           (iterator)
                           attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)local_398);
              }
              else {
                *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = fVar46;
                attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_398[0]._M_dataplus._M_p._0_4_ = fVar46;
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&attributes,
                           (iterator)
                           attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)local_398);
              }
              else {
                *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = fVar46;
                attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              fVar43 = (float)(iVar40 % iVar15) / fVar42;
              local_398[0]._M_dataplus._M_p._0_4_ = fVar43 + fVar43 + -1.0;
              if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&attributes,
                           (iterator)
                           attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)local_398);
              }
              else {
                *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_398[0]._M_dataplus._M_p._0_4_;
                attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              fVar43 = (float)(iVar40 / iVar15) / fVar42;
              local_398[0]._M_dataplus._M_p._0_4_ = fVar43 + fVar43 + -1.0;
              if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&attributes,
                           (iterator)
                           attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)local_398);
              }
              else {
                *attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_398[0]._M_dataplus._M_p._0_4_;
                attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              uVar41 = local_830;
              pCVar10 = local_8b8;
              iVar40 = iVar40 + 1;
              iVar18 = iVar18 + 1;
              local_1d8._4_4_ = iVar18;
            } while (iVar18 != 3);
            fVar16 = (float)((int)fVar16 + 1);
            local_1d8._0_4_ = fVar16;
            VVar13.m_data = _local_1d8;
          } while (fVar16 != 4.2039e-45);
          iVar18 = (uint)local_958 + 1;
          local_1c8[0]._M_allocated_capacity._4_4_ = iVar18;
        } while (iVar18 != 3);
        iVar17 = iVar17 + 1;
        local_1c8[0]._M_allocated_capacity._0_4_ = iVar17;
      } while (iVar17 != 3);
      fVar16 = (float)((int)local_840 + 1);
      uStack_1d0._4_4_ = fVar16;
    } while (fVar16 != 4.2039e-45);
    uStack_1d0._0_4_ = (float)((int)local_8b0 + 1);
    local_1d8 = VVar13.m_data._0_8_;
    uStack_1d0._4_4_ = 4.2039e-45;
    local_8b0 = (tessellation *)CONCAT44(local_8b0._4_4_,(float)uStack_1d0);
  } while ((float)uStack_1d0 != 4.2039e-45);
  local_958 = (ulong)((long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) / 10;
  if ((int)(uint)local_958 < 1) {
    local_9a8 = 0;
  }
  else {
    uVar33 = (ulong)((uint)local_958 & 0x7fffffff);
    local_9a8 = 0;
    iVar15 = 2;
    do {
      iVar40 = referenceVertexCount
                         ((TessPrimitiveType)pCVar10,(SpacingMode)uVar41,true,
                          attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + (iVar15 + -2),
                          attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + iVar15);
      pCVar11 = local_8b8;
      local_9a8 = local_9a8 + iVar40;
      iVar15 = iVar15 + 10;
      uVar33 = uVar33 - 1;
    } while (uVar33 != 0);
    if (0 < (int)(uint)local_958) {
      uVar41 = (ulong)((uint)local_958 & 0x7fffffff);
      lVar31 = 0x200000000;
      do {
        isPatchDiscarded((TessPrimitiveType)pCVar11,
                         (float *)((lVar31 >> 0x1e) +
                                  (long)attributes.super__Vector_base<float,_std::allocator<float>_>
                                        ._M_impl.super__Vector_impl_data._M_start));
        lVar31 = lVar31 + 0xa00000000;
        uVar41 = uVar41 - 1;
      } while (uVar41 != 0);
    }
  }
  TVar24 = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(TVar24);
  VVar34 = (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
  makeBufferCreateInfo((VkBufferCreateInfo *)choices,VVar34,0x80);
  pDVar21 = local_910;
  pVVar22 = local_918;
  tessellation::Buffer::Buffer
            (&local_208,local_910,local_918,local_8c0,(VkBufferCreateInfo *)choices,
             (MemoryRequirement)0x1);
  pAVar12 = local_208.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memcpy((local_208.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,
         attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start,VVar34);
  ::vk::flushMappedMemoryRange
            (pDVar21,pVVar22,(VkDeviceMemory)(pAVar12->m_memory).m_internal,pAVar12->m_offset,VVar34
            );
  makeBufferCreateInfo((VkBufferCreateInfo *)choices,4,0x20);
  tessellation::Buffer::Buffer
            (&local_4f8,pDVar21,pVVar22,local_8c0,(VkBufferCreateInfo *)choices,
             (MemoryRequirement)0x1);
  *(undefined4 *)
   (local_4f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr)->m_hostPtr = 0;
  ::vk::flushMappedMemoryRange
            (pDVar21,pVVar22,
             (VkDeviceMemory)
             ((local_4f8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_4f8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)choices,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&local_528,pDVar21,pVVar22,local_8c0,(VkImageCreateInfo *)choices,
               (MemoryRequirement)0x0);
  iVar40 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar24 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar15 = tcu::getPixelSize(TVar24);
  VVar34 = (VkDeviceSize)(iVar40 * iVar15);
  makeBufferCreateInfo((VkBufferCreateInfo *)choices,VVar34,2);
  tessellation::Buffer::Buffer
            (&local_3c8,pDVar21,pVVar22,local_8c0,(VkBufferCreateInfo *)choices,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)choices);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)choices,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,
                       (VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_1d8,this_00,pDVar21,pVVar22,0);
  DStack_540.m_device = (VkDevice)local_1c8[0]._0_8_;
  DStack_540.m_allocator = (VkAllocationCallbacks *)local_1c8[0]._8_8_;
  local_548.m_internal = (deUint64)local_1d8;
  DStack_540.m_deviceIface = (DeviceInterface *)uStack_1d0;
  local_1d8._0_4_ = 0.0;
  local_1d8._4_4_ = 0.0;
  uStack_1d0._0_4_ = 0.0;
  uStack_1d0._4_4_ = 0.0;
  local_1c8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )0x0;
  if (choices[4]._0_8_ != 0) {
    operator_delete((void *)choices[4]._0_8_,choices[5]._4_8_ - choices[4]._0_8_);
  }
  if (choices[2]._0_8_ != 0) {
    operator_delete((void *)choices[2]._0_8_,choices[3]._4_8_ - choices[2]._0_8_);
  }
  if (choices[0]._0_8_ != 0) {
    operator_delete((void *)choices[0]._0_8_,choices[1]._4_8_ - choices[0]._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_1d8);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_1d8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar21 = local_910;
  pVVar22 = local_918;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)choices,this_01,local_910,local_918,1,1);
  DStack_3e0.m_device = (VkDevice)choices[1]._4_8_;
  DStack_3e0.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_3e8.m_internal._0_4_ = choices[0][0];
  local_3e8.m_internal._4_4_ = choices[0][1];
  DStack_3e0.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = 0.0;
  choices[1][0] = 0.0;
  choices[1][1] = 0.0;
  choices[1][2] = 0.0;
  choices[2][0] = 0.0;
  choices[2][1] = 0.0;
  if (local_1d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1d8,local_1c8[0]._M_allocated_capacity - (long)local_1d8);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)choices,pDVar21,pVVar22,local_3e8,
                    local_548);
  auVar7 = choices._16_16_;
  auVar6 = choices._0_16_;
  local_5e8[0] = choices[1][1];
  local_5e8[1] = choices[1][2];
  afStack_5e0[0] = choices[2][0];
  afStack_5e0[1] = choices[2][1];
  local_5f8._0_4_ = choices[0][0];
  local_5f8._4_4_ = choices[0][1];
  plStack_5f0 = (long *)choices._8_8_;
  resultBufferInfo.buffer.m_internal =
       local_4f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = 4;
  choices._0_16_ = auVar6;
  choices._16_16_ = auVar7;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)choices);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)choices,(int)(float)local_5f8,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,local_910,local_918);
  if (choices[4]._0_8_ != 0) {
    operator_delete((void *)choices[4]._0_8_,choices[5]._4_8_ - choices[4]._0_8_);
  }
  if (choices[2]._0_8_ != 0) {
    operator_delete((void *)choices[2]._0_8_,choices[3]._4_8_ - choices[2]._0_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)choices);
  pDVar21 = local_910;
  pVVar22 = local_918;
  local_488 = 1;
  uStack_480 = 1;
  local_478 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)choices,local_910,local_918,
                (VkImage)local_528.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  auVar6 = choices._0_16_;
  DStack_400.m_device = (VkDevice)choices[1]._4_8_;
  DStack_400.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_408.m_internal._0_4_ = choices[0][0];
  local_408.m_internal._4_4_ = choices[0][1];
  DStack_400.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices._0_16_ = auVar6;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)choices,pDVar21,pVVar22,
                 VK_FORMAT_R8G8B8A8_UNORM);
  auVar6 = choices._0_16_;
  DStack_5b0.m_device = (VkDevice)choices[1]._4_8_;
  DStack_5b0.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_5b8.m_internal._0_4_ = choices[0][0];
  local_5b8.m_internal._4_4_ = choices[0][1];
  DStack_5b0.m_deviceIface = (DeviceInterface *)choices._8_8_;
  uVar37 = choices[0]._0_8_;
  choices._0_16_ = auVar6;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)choices,pDVar21,pVVar22,
                  (VkRenderPass)uVar37,local_408,renderSize.m_data[0],renderSize.m_data[1],1);
  auVar6 = choices._0_16_;
  DStack_420.m_device = (VkDevice)choices[1]._4_8_;
  DStack_420.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_428.m_internal._0_4_ = choices[0][0];
  local_428.m_internal._4_4_ = choices[0][1];
  DStack_420.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices._0_16_ = auVar6;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)choices,pDVar21,pVVar22,local_548);
  auVar6 = choices._0_16_;
  DStack_560.m_device = (VkDevice)choices[1]._4_8_;
  DStack_560.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_568.m_internal._0_4_ = choices[0][0];
  local_568.m_internal._4_4_ = choices[0][1];
  DStack_560.m_deviceIface = (DeviceInterface *)choices._8_8_;
  choices._0_16_ = auVar6;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)choices,pDVar21,pVVar22,local_834);
  auVar6 = choices._0_16_;
  DStack_440.m_device = (VkDevice)choices[1]._4_8_;
  DStack_440.m_allocator = (VkAllocationCallbacks *)choices[2]._0_8_;
  local_448.m_internal._0_4_ = choices[0][0];
  local_448.m_internal._4_4_ = choices[0][1];
  DStack_440.m_deviceIface = (DeviceInterface *)choices._8_8_;
  uVar37 = choices[0]._0_8_;
  choices._0_16_ = auVar6;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)choices,pDVar21,pVVar22,(VkCommandPool)uVar37,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  auVar6 = choices._16_16_;
  local_5c8[0] = choices[1][1];
  local_5c8[1] = choices[1][2];
  afStack_5c0[0] = choices[2][0];
  afStack_5c0[1] = choices[2][1];
  local_5d8 = (VkCommandBuffer)choices[0]._0_8_;
  plStack_5d0 = (long *)choices._8_8_;
  choices._16_16_ = auVar6;
  pIVar19 = Context::getInstanceInterface((Context *)this);
  pVVar20 = Context::getPhysicalDevice((Context *)this);
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)choices,pIVar19,pVVar20);
  memset(choices[0] + 2,0,0xf4);
  local_678 = false;
  local_674 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  choices[0][0] = (float)renderSize.m_data[0];
  choices[0][1] = (float)renderSize.m_data[1];
  local_67c = 10;
  pGVar25 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      ((GraphicsPipelineBuilder *)choices,VK_FORMAT_R32_SFLOAT,stride);
  p_Var4 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             **)(this + 0x10);
  local_398[0]._M_dataplus._M_p = (pointer)&local_398[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"vert","");
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,local_398);
  pDVar21 = local_910;
  pVVar22 = local_918;
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,local_910,local_918,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar26._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var4 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             **)(this + 0x10);
  TVar24 = (TextureFormat)(imagePixelAccess.m_size.m_data + 2);
  imagePixelAccess.m_format = TVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imagePixelAccess,"tesc","");
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&imagePixelAccess);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,pDVar21,pVVar22,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar26._M_node + 2),(VkSpecializationInfo *)0x0);
  bVar35 = local_70c != 0.0 & (byte)(local_848 >> 0x20) & 1;
  p_Var4 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             **)(this + 0x10);
  pcVar36 = "tese";
  if (bVar35 != 0) {
    pcVar36 = "tese_psw";
  }
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_938,pcVar36,pcVar36 + (ulong)bVar35 * 4 + 4);
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,&local_938);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,pDVar21,pVVar22,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar26._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var4 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             **)(this + 0x10);
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_978,"frag","");
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,&local_978);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,pDVar21,pVVar22,VK_SHADER_STAGE_FRAGMENT_BIT,
                       *(ProgramBinary **)(cVar26._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_1d8,pGVar25,pDVar21,pVVar22,local_568,
             local_5b8);
  DStack_460.m_device = (VkDevice)local_1c8[0]._0_8_;
  DStack_460.m_allocator = (VkAllocationCallbacks *)local_1c8[0]._8_8_;
  local_468.m_internal = (deUint64)local_1d8;
  DStack_460.m_deviceIface = (DeviceInterface *)uStack_1d0;
  local_1d8._0_4_ = 0.0;
  local_1d8._4_4_ = 0.0;
  uStack_1d0._0_4_ = 0.0;
  uStack_1d0._4_4_ = 0.0;
  local_1c8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
  }
  if (imagePixelAccess.m_format != TVar24) {
    operator_delete((void *)imagePixelAccess.m_format,
                    CONCAT44(imagePixelAccess.m_pitch.m_data[0],imagePixelAccess.m_size.m_data[2]) +
                    1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398[0]._M_dataplus._M_p != &local_398[0].field_2) {
    operator_delete(local_398[0]._M_dataplus._M_p,local_398[0].field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)choices);
  poVar2 = (ostringstream *)(choices[0] + 2);
  choices[0]._0_8_ = *(undefined8 *)(*(long *)this + 0x10);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Note: rendering ",0x10);
  std::ostream::operator<<(poVar2,(int)local_958);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2," patches; first patches have valid relevant outer levels, ",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,
             "but later patches have one or more invalid (i.e. less than or equal to 0.0) relevant outer levels"
             ,0x61);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_700);
  commandBuffer = local_5d8;
  pDVar21 = local_910;
  beginCommandBuffer(local_910,local_5d8);
  local_4a8 = 1;
  uStack_4a0 = 1;
  local_498 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)choices,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)local_528.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  (*pDVar21->_vptr_DeviceInterface[0x6d])
            (pDVar21,commandBuffer,1,0x80,0,0,0,0,0,1,(int)(VkImageMemoryBarrier *)choices);
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  choices[0][2] = (float)renderSize.m_data[0];
  choices[1][0] = (float)renderSize.m_data[1];
  local_1d8 = (undefined1  [8])0x0;
  uStack_1d0 = (pointer)0x3f80000000000000;
  beginRenderPass(pDVar21,commandBuffer,local_5b8,local_428,(VkRect2D *)choices,(Vec4 *)local_1d8);
  (*pDVar21->_vptr_DeviceInterface[0x4c])(pDVar21,commandBuffer,0,local_468.m_internal);
  (*pDVar21->_vptr_DeviceInterface[0x56])
            (pDVar21,commandBuffer,0,local_568.m_internal,0,1,&local_5f8,0,0);
  choices[0][0] = 0.0;
  choices[0][1] = 0.0;
  (*pDVar21->_vptr_DeviceInterface[0x58])(pDVar21,commandBuffer,0,1,&local_208);
  (*pDVar21->_vptr_DeviceInterface[0x59])
            (pDVar21,commandBuffer,
             (ulong)((long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2,1,0,0);
  endRenderPass(pDVar21,commandBuffer);
  local_4c8 = 1;
  uStack_4c0 = 1;
  local_4b8 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)choices,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)local_528.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  (*pDVar21->_vptr_DeviceInterface[0x6d])
            (pDVar21,commandBuffer,0x400,0x1000,0,0,0,0,0,1,(int)(VkImageMemoryBarrier *)choices);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)choices,extent,subresourceLayers);
  (*pDVar21->_vptr_DeviceInterface[99])
            (pDVar21,commandBuffer,
             local_528.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,
             local_3c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)(VkBufferImageCopy *)choices);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)choices,0x1000,0x2000,
             (VkBuffer)
             local_3c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,VVar34);
  (*pDVar21->_vptr_DeviceInterface[0x6d])
            (pDVar21,commandBuffer,0x1000,0x4000,0,0,0,1,(VkBufferMemoryBarrier *)choices,0,0);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)choices,0x40,0x2000,
             (VkBuffer)
             local_4f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,4);
  (*pDVar21->_vptr_DeviceInterface[0x6d])
            (pDVar21,commandBuffer,0x8000,0x4000,0,0,0,1,(VkBufferMemoryBarrier *)choices,0,0);
  endCommandBuffer(pDVar21,commandBuffer);
  pVVar22 = local_918;
  submitCommandsAndWait(pDVar21,local_918,local_590,commandBuffer);
  pAVar12 = local_3c8.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (pDVar21,pVVar22,
             (VkDeviceMemory)
             ((local_3c8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_3c8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,VVar34);
  TVar24 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  choices[0][0] = (float)TVar24.order;
  choices[0][1] = (float)TVar24.type;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&imagePixelAccess,(TextureFormat *)choices,renderSize.m_data[0],renderSize.m_data[1],1,
             pAVar12->m_hostPtr);
  uVar37 = *(undefined8 *)(*(long *)this + 0x10);
  local_1d8 = (undefined1  [8])local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"color0","");
  local_398[0]._M_dataplus._M_p = (pointer)&local_398[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Rendered image","");
  access = &imagePixelAccess;
  tcu::LogImage::LogImage
            ((LogImage *)choices,(string *)local_1d8,local_398,access,QP_IMAGE_COMPRESSION_MODE_BEST
            );
  tcu::LogImage::write((LogImage *)choices,(int)(float)uVar37,__buf,(size_t)access);
  if ((float (*) [3])choices._32_8_ != choices + 4) {
    operator_delete((void *)choices._32_8_,choices[4]._0_8_ + 1);
  }
  if ((float *)choices[0]._0_8_ != choices[1] + 1) {
    operator_delete((void *)choices[0]._0_8_,choices[1]._4_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398[0]._M_dataplus._M_p != &local_398[0].field_2) {
    operator_delete(local_398[0]._M_dataplus._M_p,local_398[0].field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != (undefined1  [8])local_1c8) {
    operator_delete((void *)local_1d8,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
  }
  pAVar12 = local_4f8.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (local_910,local_918,
             (VkDeviceMemory)
             ((local_4f8.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (local_4f8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,4);
  iVar15 = *pAVar12->m_hostPtr;
  if (((((local_848 >> 0x28 & 1) == 0) || (1 < (uint)local_8b8)) ||
      (local_848 = local_848 & 0x100000000, local_848 == 0)) || ((int)local_830 != 1)) {
    if (iVar15 < (int)local_9a8) {
      poVar2 = (ostringstream *)(choices[0] + 2);
      choices[0]._0_8_ = uVar37;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Failure: expected ",0x12);
      std::ostream::operator<<(poVar2,local_9a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2," vertices from shader invocations, but got only ",0x30);
      std::ostream::operator<<(poVar2,iVar15);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_700);
      choices[0]._0_8_ = choices[1] + 1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)choices,"Wrong number of tessellation coordinates","");
      local_8c8->m_code = QP_TEST_RESULT_FAIL;
      (local_8c8->m_description)._M_dataplus._M_p = (pointer)&(local_8c8->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8c8->m_description,choices[0]._0_8_,
                 choices._8_8_ + choices[0]._0_8_);
      goto LAB_0076c762;
    }
    if (iVar15 - local_9a8 == 0) {
      poVar2 = (ostringstream *)(choices[0] + 2);
      choices[0][0] = (float)uVar37;
      choices[0][1] = SUB84(uVar37,4);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Note: shader invocations generated ",0x23);
      std::ostream::operator<<(poVar2,local_9a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," vertices",9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar2 = (ostringstream *)(choices[0] + 2);
      choices[0][0] = (float)uVar37;
      choices[0][1] = SUB84(uVar37,4);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Note: shader invocations generated ",0x23);
      std::ostream::operator<<(poVar2,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2," vertices (expected ",0x14);
      std::ostream::operator<<(poVar2,local_9a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", got ",6);
      std::ostream::operator<<(poVar2,iVar15 - local_9a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," extra)",7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    poVar2 = (ostringstream *)(choices[0] + 2);
    choices[0][0] = (float)uVar37;
    choices[0][1] = SUB84(uVar37,4);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Note: shader invocations generated ",0x23);
    std::ostream::operator<<(poVar2,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               " vertices (not verified as number of vertices is implementation-dependent)",0x4a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(choices[0] + 2));
  std::ios_base::~ios_base(local_700);
  local_828 = imagePixelAccess.m_format;
  iStack_820 = imagePixelAccess.m_size.m_data[0];
  iStack_81c = imagePixelAccess.m_size.m_data[1];
  local_818 = imagePixelAccess.m_size.m_data[2];
  local_80c = imagePixelAccess.m_pitch.m_data[2];
  local_808 = imagePixelAccess.m_data;
  local_48 = 0;
  auStack_40[0] = 0x3f80000000000000;
  local_58 = 0x3f8000003f800000;
  uStack_50 = 0x3f8000003f800000;
  if (0 < (int)(uint)local_958) {
    local_958 = (ulong)((uint)local_958 & 0x7fffffff);
    uVar41 = 0;
    local_9a4 = 0;
    local_9a8 = 0;
    iVar15 = 0;
    do {
      pfVar9 = attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar31 = (long)(uVar41 * 0xa00000000) >> 0x1e;
      bVar14 = isPatchDiscarded((TessPrimitiveType)local_8b8,
                                (float *)((long)attributes.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start +
                                         lVar31 + 8));
      if (bVar14) {
        if (0 < iStack_81c) {
          iVar18 = 0;
          iVar40 = iStack_81c;
          iVar17 = iStack_820;
          do {
            if (0 < iVar17) {
              iVar40 = 0;
              do {
                if (((int)local_9a4 < iVar18) || ((int)local_9a8 < iVar18 && iVar15 < iVar40)) {
                  tcu::ConstPixelBufferAccess::getPixel
                            ((ConstPixelBufferAccess *)choices,(int)&local_828,iVar40,iVar18);
                  if ((choices[0][0] == 0.0) && (!NAN(choices[0][0]))) {
                    uVar41 = 0xffffffffffffffff;
                    do {
                      if (uVar41 == 2) goto LAB_0076bc9a;
                      lVar31 = uVar41 + 2;
                      uVar33 = uVar41 + 1;
                      pfVar32 = (float *)((long)auStack_40 + uVar41 * 4);
                    } while ((choices[0][lVar31] == *pfVar32) &&
                            (uVar41 = uVar33, !NAN(choices[0][lVar31]) && !NAN(*pfVar32)));
                    if (2 < uVar33) goto LAB_0076bc9a;
                  }
                  local_1d8._0_4_ = (float)uVar37;
                  local_1d8._4_4_ = SUB84(uVar37,4);
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1d0,
                             "Failure: expected all pixels to be black in the area ",0x35);
                  iVar17 = iStack_820 + -1;
                  if (iVar15 < iVar17) {
                    local_588 = (ulong *)&local_578;
                    local_580 = 0;
                    local_578 = 0;
                    plVar29 = (long *)std::__cxx11::string::append((char *)&local_588);
                    local_888 = &local_878;
                    puVar38 = (ulong *)(plVar29 + 2);
                    if ((ulong *)*plVar29 == puVar38) {
                      local_878 = *puVar38;
                      lStack_870 = plVar29[3];
                    }
                    else {
                      local_878 = *puVar38;
                      local_888 = (ulong *)*plVar29;
                    }
                    local_880 = plVar29[1];
                    *plVar29 = (long)puVar38;
                    plVar29[1] = 0;
                    *(undefined1 *)(plVar29 + 2) = 0;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
                    std::ostream::operator<<(local_398,local_9a4);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
                    std::ios_base::~ios_base(local_328);
                    uVar41 = 0xf;
                    if (local_888 != &local_878) {
                      uVar41 = local_878;
                    }
                    if (uVar41 < (ulong)(local_7b8 + local_880)) {
                      uVar41 = 0xf;
                      if (local_7c0 != local_7b0) {
                        uVar41 = local_7b0[0];
                      }
                      if (uVar41 < (ulong)(local_7b8 + local_880)) goto LAB_0076bef6;
                      puVar30 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_7c0,0,(char *)0x0,(ulong)local_888);
                    }
                    else {
LAB_0076bef6:
                      puVar30 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_888,(ulong)local_7c0)
                      ;
                    }
                    local_8a8 = &local_898;
                    plVar29 = puVar30 + 2;
                    if ((long *)*puVar30 == plVar29) {
                      local_898 = *plVar29;
                      uStack_890 = puVar30[3];
                    }
                    else {
                      local_898 = *plVar29;
                      local_8a8 = (long *)*puVar30;
                    }
                    local_8a0 = puVar30[1];
                    *puVar30 = plVar29;
                    puVar30[1] = 0;
                    *(undefined1 *)plVar29 = 0;
                    plVar29 = (long *)std::__cxx11::string::append((char *)&local_8a8);
                    local_868 = &local_858;
                    puVar38 = (ulong *)(plVar29 + 2);
                    if ((ulong *)*plVar29 == puVar38) {
                      local_858 = *puVar38;
                      lStack_850 = plVar29[3];
                    }
                    else {
                      local_858 = *puVar38;
                      local_868 = (ulong *)*plVar29;
                    }
                    local_860 = plVar29[1];
                    *plVar29 = (long)puVar38;
                    plVar29[1] = 0;
                    *(undefined1 *)(plVar29 + 2) = 0;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
                    std::ostream::operator<<(local_398,local_9a8);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
                    std::ios_base::~ios_base(local_328);
                    uVar41 = 0xf;
                    if (local_868 != &local_858) {
                      uVar41 = local_858;
                    }
                    if (uVar41 < (ulong)(local_7d8 + local_860)) {
                      uVar41 = 0xf;
                      if (local_7e0 != local_7d0) {
                        uVar41 = local_7d0[0];
                      }
                      if (uVar41 < (ulong)(local_7d8 + local_860)) goto LAB_0076c184;
                      puVar30 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_7e0,0,(char *)0x0,(ulong)local_868);
                    }
                    else {
LAB_0076c184:
                      puVar30 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_868,(ulong)local_7e0)
                      ;
                    }
                    local_908 = &local_8f8;
                    puVar38 = puVar30 + 2;
                    if ((ulong *)*puVar30 == puVar38) {
                      local_8f8 = *puVar38;
                      uStack_8f0 = puVar30[3];
                    }
                    else {
                      local_8f8 = *puVar38;
                      local_908 = (ulong *)*puVar30;
                    }
                    local_900 = puVar30[1];
                    *puVar30 = puVar38;
                    puVar30[1] = 0;
                    *(undefined1 *)puVar38 = 0;
                    plVar29 = (long *)std::__cxx11::string::append((char *)&local_908);
                    local_8e8 = &local_8d8;
                    puVar38 = (ulong *)(plVar29 + 2);
                    if ((ulong *)*plVar29 == puVar38) {
                      local_8d8 = *puVar38;
                      lStack_8d0 = plVar29[3];
                    }
                    else {
                      local_8d8 = *puVar38;
                      local_8e8 = (ulong *)*plVar29;
                    }
                    local_8e0 = plVar29[1];
                    *plVar29 = (long)puVar38;
                    plVar29[1] = 0;
                    *(undefined1 *)(plVar29 + 2) = 0;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
                    std::ostream::operator<<(local_398,iVar15);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
                    std::ios_base::~ios_base(local_328);
                    uVar41 = 0xf;
                    if (local_8e8 != &local_8d8) {
                      uVar41 = local_8d8;
                    }
                    if (uVar41 < (ulong)(local_7f8 + local_8e0)) {
                      uVar41 = 0xf;
                      if (local_800 != local_7f0) {
                        uVar41 = local_7f0[0];
                      }
                      if (uVar41 < (ulong)(local_7f8 + local_8e0)) goto LAB_0076c342;
                      puVar30 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_800,0,(char *)0x0,(ulong)local_8e8);
                    }
                    else {
LAB_0076c342:
                      puVar30 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_8e8,(ulong)local_800)
                      ;
                    }
                    local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
                    puVar38 = puVar30 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar30 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar38) {
                      local_978.field_2._M_allocated_capacity = *puVar38;
                      local_978.field_2._8_8_ = puVar30[3];
                    }
                    else {
                      local_978.field_2._M_allocated_capacity = *puVar38;
                      local_978._M_dataplus._M_p = (pointer)*puVar30;
                    }
                    local_978._M_string_length = puVar30[1];
                    *puVar30 = puVar38;
                    puVar30[1] = 0;
                    *(undefined1 *)puVar38 = 0;
                    puVar30 = (undefined8 *)std::__cxx11::string::append((char *)&local_978);
                  }
                  else {
                    local_8e8 = &local_8d8;
                    local_8e0 = 0;
                    local_8d8 = local_8d8 & 0xffffffffffffff00;
                    puVar30 = (undefined8 *)std::__cxx11::string::append((char *)&local_8e8);
                    local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
                    puVar38 = puVar30 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar30 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar38) {
                      local_978.field_2._M_allocated_capacity = *puVar38;
                      local_978.field_2._8_8_ = puVar30[3];
                    }
                    else {
                      local_978.field_2._M_allocated_capacity = *puVar38;
                      local_978._M_dataplus._M_p = (pointer)*puVar30;
                    }
                    local_978._M_string_length = puVar30[1];
                    *puVar30 = puVar38;
                    puVar30[1] = 0;
                    *(undefined1 *)(puVar30 + 2) = 0;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
                    std::ostream::operator<<(local_398,local_9a4);
                    std::__cxx11::stringbuf::str();
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
                    std::ios_base::~ios_base(local_328);
                    uVar37 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_978._M_dataplus._M_p != &local_978.field_2) {
                      uVar37 = local_978.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar37 < local_900 + local_978._M_string_length) {
                      uVar41 = 0xf;
                      if (local_908 != &local_8f8) {
                        uVar41 = local_8f8;
                      }
                      if (uVar41 < local_900 + local_978._M_string_length) goto LAB_0076bfdb;
                      puVar30 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_908,0,(char *)0x0,
                                           (ulong)local_978._M_dataplus._M_p);
                    }
                    else {
LAB_0076bfdb:
                      puVar30 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_978,(ulong)local_908)
                      ;
                    }
                  }
                  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
                  psVar1 = puVar30 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar30 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_938.field_2._M_allocated_capacity = *psVar1;
                    local_938.field_2._8_8_ = puVar30[3];
                  }
                  else {
                    local_938.field_2._M_allocated_capacity = *psVar1;
                    local_938._M_dataplus._M_p = (pointer)*puVar30;
                  }
                  local_938._M_string_length = puVar30[1];
                  *puVar30 = psVar1;
                  puVar30[1] = 0;
                  *(undefined1 *)psVar1 = 0;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1d0,local_938._M_dataplus._M_p,
                             local_938._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&uStack_1d0,
                             " (they all correspond to patches that should be discarded)",0x3a);
                  pTVar28 = tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)local_1d8,
                                       (EndMessageToken *)&tcu::TestLog::EndMessage);
                  choices[0]._0_8_ = pTVar28;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(choices[0] + 2));
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(choices[0] + 2),"Note: pixel ",0xc);
                  local_398[0]._M_dataplus._M_p._4_4_ = iVar18;
                  local_398[0]._M_dataplus._M_p._0_4_ = (float)iVar40;
                  tcu::operator<<((ostream *)(choices[0] + 2),(Vector<int,_2> *)local_398);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(choices[0] + 2)," isn\'t black",0xc);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage)
                  ;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(choices[0] + 2));
                  std::ios_base::~ios_base(local_700);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_938._M_dataplus._M_p != &local_938.field_2) {
                    operator_delete(local_938._M_dataplus._M_p,
                                    local_938.field_2._M_allocated_capacity + 1);
                  }
                  if (iVar15 < iVar17) {
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_978._M_dataplus._M_p != &local_978.field_2) {
                      operator_delete(local_978._M_dataplus._M_p,
                                      local_978.field_2._M_allocated_capacity + 1);
                    }
                    if (local_800 != local_7f0) {
                      operator_delete(local_800,local_7f0[0] + 1);
                    }
                    if (local_8e8 != &local_8d8) {
                      operator_delete(local_8e8,local_8d8 + 1);
                    }
                    if (local_908 != &local_8f8) {
                      operator_delete(local_908,local_8f8 + 1);
                    }
                    if (local_7e0 != local_7d0) {
                      operator_delete(local_7e0,local_7d0[0] + 1);
                    }
                    if (local_868 != &local_858) {
                      operator_delete(local_868,local_858 + 1);
                    }
                    if (local_8a8 != &local_898) {
                      operator_delete(local_8a8,local_898 + 1);
                    }
                    if (local_7c0 != local_7b0) {
                      operator_delete(local_7c0,local_7b0[0] + 1);
                    }
                    if (local_888 != &local_878) {
                      operator_delete(local_888,local_878 + 1);
                    }
                    if (local_588 == (ulong *)&local_578) goto LAB_0076c6f8;
                    uVar41 = CONCAT71(uStack_577,local_578);
                    puVar38 = local_588;
                  }
                  else {
                    if (local_908 != &local_8f8) {
                      operator_delete(local_908,local_8f8 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_978._M_dataplus._M_p != &local_978.field_2) {
                      operator_delete(local_978._M_dataplus._M_p,
                                      local_978.field_2._M_allocated_capacity + 1);
                    }
                    uVar41 = local_8d8;
                    puVar38 = local_8e8;
                    if (local_8e8 == &local_8d8) goto LAB_0076c6f8;
                  }
                  operator_delete(puVar38,uVar41 + 1);
                  goto LAB_0076c6f8;
                }
LAB_0076bc9a:
                iVar40 = iVar40 + 1;
              } while (iVar40 < iStack_820);
              iVar40 = iStack_81c;
              iVar17 = iStack_820;
            }
            iVar18 = iVar18 + 1;
          } while (iVar18 < iVar40);
        }
        break;
      }
      local_8b0 = (tessellation *)((long)pfVar9 + lVar31);
      iVar40 = (int)((*(float *)(local_8b0 + 0x20) + 1.0) * 0.5 * (float)iStack_820) + -1;
      iVar15 = (int)((*(float *)(local_8b0 + 0x20) + *(float *)(local_8b0 + 0x18) + 1.0) * 0.5 *
                    (float)iStack_820) + 1;
      uVar44 = (int)((float)iStack_81c * (*(float *)(local_8b0 + 0x24) + 1.0) * 0.5) - 1;
      uVar45 = (int)((float)iStack_81c *
                    (*(float *)(local_8b0 + 0x1c) + *(float *)(local_8b0 + 0x24) + 1.0) * 0.5) + 1;
      uVar5 = local_9a4;
      if ((int)local_9a4 < (int)uVar45) {
        uVar5 = uVar45;
        local_9a8 = local_9a4;
      }
      pfVar32 = (float *)(ulong)uVar5;
      local_840 = uVar41;
      if ((int)uVar45 < (int)uVar44) {
LAB_0076ba5a:
        local_1d8._0_4_ = (float)uVar37;
        local_1d8._4_4_ = SUB84(uVar37,4);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_1d0,
                   "Failure: expected at least one white pixel in the rectangle ",0x3c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,"[x0=",4);
        std::ostream::operator<<((ostringstream *)&uStack_1d0,iVar40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,", y0=",5);
        std::ostream::operator<<((ostringstream *)&uStack_1d0,uVar44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,", x1=",5);
        std::ostream::operator<<((ostringstream *)&uStack_1d0,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,", y1=",5);
        std::ostream::operator<<((ostringstream *)&uStack_1d0,uVar45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1d0,"]",1);
        pTVar28 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1d8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
        poVar2 = (ostringstream *)(choices[0] + 2);
        choices[0]._0_8_ = pTVar28;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,
                   "Note: the rectangle approximately corresponds to the patch with these tessellation levels: "
                   ,0x5b);
        getTessellationLevelsString_abi_cxx11_(local_398,local_8b0,(float *)(local_8b0 + 4),pfVar32)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,local_398[0]._M_dataplus._M_p,local_398[0]._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)choices,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398[0]._M_dataplus._M_p != &local_398[0].field_2) {
          operator_delete(local_398[0]._M_dataplus._M_p,
                          local_398[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        std::ios_base::~ios_base(local_700);
LAB_0076c6f8:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
        std::ios_base::~ios_base(local_160);
        choices[0]._0_8_ = choices[1] + 1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)choices,"Image verification failed","");
        local_8c8->m_code = QP_TEST_RESULT_FAIL;
        (local_8c8->m_description)._M_dataplus._M_p = (pointer)&(local_8c8->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8c8->m_description,choices[0]._0_8_,
                   choices._8_8_ + choices[0]._0_8_);
        goto LAB_0076c762;
      }
      bVar14 = false;
      z = uVar44;
      do {
        iVar17 = iVar40;
        bVar8 = (bool)(iVar15 < iVar40 | bVar14);
        do {
          if (bVar8) break;
          if ((((-1 < iVar17) && (iVar17 < iStack_820)) && (-1 < (int)z)) && ((int)z < iStack_81c))
          {
            pfVar32 = (float *)(ulong)z;
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)choices,(int)&local_828,iVar17,z);
            if ((choices[0][0] == 1.0) && (!NAN(choices[0][0]))) {
              pfVar27 = (float *)0xffffffffffffffff;
              do {
                if (pfVar27 == (float *)0x2) goto LAB_0076ba10;
                lVar31 = (long)pfVar27 + 2;
                pfVar32 = (float *)((long)pfVar27 + 1);
                pfVar3 = (float *)((long)&uStack_50 + (long)pfVar27 * 4);
              } while ((choices[0][lVar31] == *pfVar3) &&
                      (pfVar27 = pfVar32, !NAN(choices[0][lVar31]) && !NAN(*pfVar3)));
              if ((float *)0x2 < pfVar32) {
LAB_0076ba10:
                bVar14 = true;
              }
            }
          }
          iVar17 = iVar17 + 1;
          bVar8 = bVar14;
        } while (iVar17 <= iVar15);
        z = z + 1;
      } while (((int)z <= (int)uVar45) && (!bVar14));
      if (!bVar14) goto LAB_0076ba5a;
      uVar41 = local_840 + 1;
      local_9a4 = uVar5;
    } while (uVar41 != local_958);
  }
  choices[0]._0_8_ = choices[1] + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)choices,"OK","");
  local_8c8->m_code = QP_TEST_RESULT_PASS;
  (local_8c8->m_description)._M_dataplus._M_p = (pointer)&(local_8c8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8c8->m_description,choices[0]._0_8_,choices._8_8_ + choices[0]._0_8_);
LAB_0076c762:
  if ((float *)choices[0]._0_8_ != choices[1] + 1) {
    operator_delete((void *)choices[0]._0_8_,choices[1]._4_8_ + 1);
  }
  if (local_468.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_460,local_468);
  }
  if (local_5d8 != (VkCommandBuffer)0x0) {
    choices[0]._0_8_ = local_5d8;
    (**(code **)(*plStack_5d0 + 0x240))(plStack_5d0,local_5c8,afStack_5c0,1);
  }
  if (local_448.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_440,local_448);
  }
  if (local_568.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_560,local_568);
  }
  if (local_428.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_420,local_428);
  }
  if (local_5b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_5b0,local_5b8);
  }
  if (local_408.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_400,local_408);
  }
  if (local_5f8 != 0) {
    choices[0][0] = (float)(undefined4)local_5f8;
    choices[0][1] = (float)local_5f8._4_4_;
    (**(code **)(*plStack_5f0 + 0x1e8))(plStack_5f0,local_5e8,afStack_5e0,1);
  }
  if (local_3e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_3e0,local_3e8);
  }
  if (local_548.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_540,local_548);
  }
  if (local_3c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_3c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_3c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_3c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_3c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_3c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_528.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_528.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_528.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_528.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_528.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_528.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                        object.m_internal);
  }
  if (local_4f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_4f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_4f8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_4f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_4f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_4f8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_208.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_208.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_208.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_208.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)attributes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_8c8;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const std::vector<float>	attributes				= genAttributes(caseDef.useLessThanOneInnerLevels);
	const int					numAttribsPerPrimitive	= 6 + 2 + 2; // Tess levels, scale, offset.
	const int					numPrimitives			= static_cast<int>(attributes.size() / numAttribsPerPrimitive);
	const int					numExpectedVertices		= expectedVertexCount(numPrimitives, numAttribsPerPrimitive, caseDef.primitiveType, caseDef.spacingMode, attributes);

	// Check the convenience assertion that all discarded patches come after the last non-discarded patch.
	{
		bool discardedPatchEncountered = false;
		for (int patchNdx = 0; patchNdx < numPrimitives; ++patchNdx)
		{
			const bool discard = isPatchDiscarded(caseDef.primitiveType, &attributes[numAttribsPerPrimitive*patchNdx + 2]);
			DE_ASSERT(discard || !discardedPatchEncountered);
			discardedPatchEncountered = discard;
		}
		DE_UNREF(discardedPatchEncountered);
	}

	// Vertex input attributes buffer

	const VkFormat	   vertexFormat		   = VK_FORMAT_R32_SFLOAT;
	const deUint32	   vertexStride		   = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes = sizeInBytes(attributes);
	const Buffer	   vertexBuffer		   (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	DE_ASSERT(static_cast<int>(attributes.size()) == numPrimitives * numAttribsPerPrimitive);
	DE_ASSERT(sizeof(attributes[0]) == vertexStride);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &attributes[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Output buffer: number of invocations

	const VkDeviceSize resultBufferSizeBytes = sizeof(deInt32);
	const Buffer	   resultBuffer			 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(256, 256);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification

	const VkDeviceSize colorBufferSizeBytes = renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer colorBuffer(vk, device, allocator,
		makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView	(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass			(makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer			(makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool				(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const bool						needPointSizeWrite	= getPhysicalDeviceFeatures(context.getInstanceInterface(), context.getPhysicalDevice()).shaderTessellationAndGeometryPointSize && caseDef.usePointMode;

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setRenderSize				  (renderSize)
		.setPatchControlPoints		  (numAttribsPerPrimitive)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get(needPointSizeWrite ? "tese_psw" : "tese"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				context.getBinaryCollection().get("frag"), DE_NULL)
		.build						  (vk, device, *pipelineLayout, *renderPass));

	context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Note: rendering " << numPrimitives << " patches; first patches have valid relevant outer levels, "
		<< "but later patches have one or more invalid (i.e. less than or equal to 0.0) relevant outer levels"
		<< tcu::TestLog::EndMessage;

	// Draw commands

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(attributes.size()), 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}
	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	{
		// Log rendered image
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);

		const tcu::ConstPixelBufferAccess imagePixelAccess(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, colorBufferAlloc.getHostPtr());

		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::TestLog::Image("color0", "Rendered image", imagePixelAccess);

		// Verify case result
		const Allocation& resultAlloc = resultBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

		const deInt32 numResultVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());

		if (!lessThanOneInnerLevelsDefined(caseDef) && caseDef.useLessThanOneInnerLevels)
		{
			// Since we cannot explicitly determine whether or not such interior vertices are going to be
			// generated, we will not verify the number of generated vertices for fractional odd + quads/triangles
			// tessellation configurations.
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices (not verified as number of vertices is implementation-dependent)"
				<< tcu::TestLog::EndMessage;
		}
		else if (numResultVertices < numExpectedVertices)
		{
			log << tcu::TestLog::Message
				<< "Failure: expected " << numExpectedVertices << " vertices from shader invocations, but got only " << numResultVertices
				<< tcu::TestLog::EndMessage;
			return tcu::TestStatus::fail("Wrong number of tessellation coordinates");
		}
		else if (numResultVertices == numExpectedVertices)
		{
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices"
				<< tcu::TestLog::EndMessage;
		}
		else
		{
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices (expected " << numExpectedVertices << ", got "
				<< (numResultVertices - numExpectedVertices) << " extra)"
				<< tcu::TestLog::EndMessage;
		}

		return (verifyResultImage(log, numPrimitives, numAttribsPerPrimitive, caseDef.primitiveType, attributes, imagePixelAccess)
				? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image verification failed"));
	}
}